

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  Index IVar1;
  size_type sVar2;
  const_reference this_00;
  pointer base;
  ModuleCommand *pMVar3;
  ModuleCommand *command;
  Index index;
  Var *var_local;
  Script *this_local;
  
  IVar1 = BindingHash::FindIndex(&this->module_bindings,var);
  sVar2 = std::
          vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
          ::size(&this->commands);
  if (IVar1 < sVar2) {
    this_00 = std::
              vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
              ::operator[](&this->commands,(ulong)IVar1);
    base = std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::get(this_00);
    pMVar3 = cast<wabt::ModuleCommand,wabt::Command>(base);
    this_local = (Script *)&pMVar3->module;
  }
  else {
    this_local = (Script *)0x0;
  }
  return (Module *)this_local;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = cast<ModuleCommand>(commands[index].get());
  return &command->module;
}